

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildLong3
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  OpCode OVar4;
  RegOpnd *pRVar5;
  RegOpnd *this_00;
  undefined4 *puVar6;
  OpCode op_1;
  Instr *pIStack_60;
  OpCode op;
  Instr *instr;
  RegOpnd *dstOpnd;
  RegOpnd *src2Opnd;
  RegOpnd *local_30;
  RegOpnd *src1Opnd;
  RegSlot src2RegSlot_local;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  local_30 = BuildSrcOpnd(this,src1RegSlot,TyInt64);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&local_30->super_Opnd,VVar3);
  pRVar5 = BuildSrcOpnd(this,src2RegSlot,TyInt64);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&pRVar5->super_Opnd,VVar3);
  this_00 = BuildDstOpnd(this,dstRegSlot,TyInt64);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,VVar3);
  pIStack_60 = (Instr *)0x0;
  switch(newOpcode) {
  case Add_Long:
    pIStack_60 = IR::Instr::New(Add_I4,&this_00->super_Opnd,&local_30->super_Opnd,
                                &pRVar5->super_Opnd,this->m_func);
    break;
  case Sub_Long:
    pIStack_60 = IR::Instr::New(Sub_I4,&this_00->super_Opnd,&local_30->super_Opnd,
                                &pRVar5->super_Opnd,this->m_func);
    break;
  case Mul_Long:
    pIStack_60 = IR::Instr::New(Mul_I4,&this_00->super_Opnd,&local_30->super_Opnd,
                                &pRVar5->super_Opnd,this->m_func);
    break;
  case Div_Trap_ULong:
    IR::Opnd::SetType(&local_30->super_Opnd,TyUint64);
    IR::Opnd::SetType(&pRVar5->super_Opnd,TyUint64);
  case Div_Trap_Long:
    pRVar5 = BuildTrapIfZero(this,pRVar5,offset);
    if (newOpcode == Div_Trap_Long) {
      local_30 = BuildTrapIfMinIntOverNegOne(this,local_30,pRVar5,offset);
    }
    OVar4 = Div_I4;
    if (newOpcode == Div_Trap_ULong) {
      OVar4 = DivU_I4;
    }
    pIStack_60 = IR::Instr::New(OVar4,&this_00->super_Opnd,&local_30->super_Opnd,&pRVar5->super_Opnd
                                ,this->m_func);
    break;
  case Rem_Trap_ULong:
    IR::Opnd::SetType(&local_30->super_Opnd,TyUint64);
    IR::Opnd::SetType(&pRVar5->super_Opnd,TyUint64);
  case Rem_Trap_Long:
    pRVar5 = BuildTrapIfZero(this,pRVar5,offset);
    OVar4 = Rem_I4;
    if (newOpcode == Rem_Trap_ULong) {
      OVar4 = RemU_I4;
    }
    pIStack_60 = IR::Instr::New(OVar4,&this_00->super_Opnd,&local_30->super_Opnd,&pRVar5->super_Opnd
                                ,this->m_func);
    break;
  case And_Long:
    pIStack_60 = IR::Instr::New(And_I4,&this_00->super_Opnd,&local_30->super_Opnd,
                                &pRVar5->super_Opnd,this->m_func);
    break;
  case Or_Long:
    pIStack_60 = IR::Instr::New(Or_I4,&this_00->super_Opnd,&local_30->super_Opnd,&pRVar5->super_Opnd
                                ,this->m_func);
    break;
  case Xor_Long:
    pIStack_60 = IR::Instr::New(Xor_I4,&this_00->super_Opnd,&local_30->super_Opnd,
                                &pRVar5->super_Opnd,this->m_func);
    break;
  case Shl_Long:
    pIStack_60 = IR::Instr::New(Shl_I4,&this_00->super_Opnd,&local_30->super_Opnd,
                                &pRVar5->super_Opnd,this->m_func);
    break;
  case Shr_ULong:
    pIStack_60 = IR::Instr::New(ShrU_I4,&this_00->super_Opnd,&local_30->super_Opnd,
                                &pRVar5->super_Opnd,this->m_func);
    break;
  case Shr_Long:
    pIStack_60 = IR::Instr::New(Shr_I4,&this_00->super_Opnd,&local_30->super_Opnd,
                                &pRVar5->super_Opnd,this->m_func);
    break;
  case Rol_Long:
    pIStack_60 = IR::Instr::New(Rol_I4,&this_00->super_Opnd,&local_30->super_Opnd,
                                &pRVar5->super_Opnd,this->m_func);
    break;
  case Ror_Long:
    pIStack_60 = IR::Instr::New(Ror_I4,&this_00->super_Opnd,&local_30->super_Opnd,
                                &pRVar5->super_Opnd,this->m_func);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xcbb,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  AddInstr(this,pIStack_60,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildLong3(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot, Js::RegSlot src2RegSlot)
{
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TyInt64);
    src1Opnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TyInt64);
    src2Opnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Add_Long:
        instr = IR::Instr::New(Js::OpCode::Add_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;

    case Js::OpCodeAsmJs::Sub_Long:
        instr = IR::Instr::New(Js::OpCode::Sub_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;

    case Js::OpCodeAsmJs::Mul_Long:
        instr = IR::Instr::New(Js::OpCode::Mul_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Div_Trap_ULong:
        src1Opnd->SetType(TyUint64);
        src2Opnd->SetType(TyUint64);
        // Fall Through for trap
    case Js::OpCodeAsmJs::Div_Trap_Long:
    {
#ifdef _WIN32
        if (CONFIG_FLAG(WasmMathExFilter))
        {
            // Do not emit traps, but make sure we don't remove the div
            dstOpnd->m_dontDeadStore = true;
        }
        else
#endif
        {
            src2Opnd = BuildTrapIfZero(src2Opnd, offset);
            if (newOpcode == Js::OpCodeAsmJs::Div_Trap_Long)
            {
                src1Opnd = BuildTrapIfMinIntOverNegOne(src1Opnd, src2Opnd, offset);
            }
        }
        Js::OpCode op = newOpcode == Js::OpCodeAsmJs::Div_Trap_ULong ? Js::OpCode::DivU_I4 : Js::OpCode::Div_I4;
        instr = IR::Instr::New(op, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    }
    case Js::OpCodeAsmJs::Rem_Trap_ULong:
        src1Opnd->SetType(TyUint64);
        src2Opnd->SetType(TyUint64);
        // Fall Through for trap
    case Js::OpCodeAsmJs::Rem_Trap_Long:
    {
#ifdef _WIN32
        if (CONFIG_FLAG(WasmMathExFilter))
        {
            // Do not emit traps, but make sure we don't remove the rem
            dstOpnd->m_dontDeadStore = true;
        }
        else
#endif
        {
            src2Opnd = BuildTrapIfZero(src2Opnd, offset);
        }
        Js::OpCode op = newOpcode == Js::OpCodeAsmJs::Rem_Trap_ULong ? Js::OpCode::RemU_I4 : Js::OpCode::Rem_I4;
        instr = IR::Instr::New(op, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    }
    case Js::OpCodeAsmJs::And_Long:
        instr = IR::Instr::New(Js::OpCode::And_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Or_Long:
        instr = IR::Instr::New(Js::OpCode::Or_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Xor_Long:
        instr = IR::Instr::New(Js::OpCode::Xor_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Shl_Long:
        instr = IR::Instr::New(Js::OpCode::Shl_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Shr_Long:
        instr = IR::Instr::New(Js::OpCode::Shr_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Shr_ULong:
        instr = IR::Instr::New(Js::OpCode::ShrU_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Rol_Long:
        instr = IR::Instr::New(Js::OpCode::Rol_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Ror_Long:
        instr = IR::Instr::New(Js::OpCode::Ror_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    default:
        Assume(UNREACHED);
    }
    AddInstr(instr, offset);
}